

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts5NewTransaction(Fts5FullTable *pTab)

{
  int iVar1;
  long in_RDI;
  Fts5Cursor *pCsr;
  long *local_18;
  
  local_18 = *(long **)(*(long *)(in_RDI + 0x30) + 0x58);
  while( true ) {
    if (local_18 == (long *)0x0) {
      iVar1 = sqlite3Fts5StorageReset((Fts5Storage *)0x26af15);
      return iVar1;
    }
    if (*local_18 == in_RDI) break;
    local_18 = (long *)local_18[1];
  }
  return 0;
}

Assistant:

static int fts5NewTransaction(Fts5FullTable *pTab){
  Fts5Cursor *pCsr;
  for(pCsr=pTab->pGlobal->pCsr; pCsr; pCsr=pCsr->pNext){
    if( pCsr->base.pVtab==(sqlite3_vtab*)pTab ) return SQLITE_OK;
  }
  return sqlite3Fts5StorageReset(pTab->pStorage);
}